

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
::emplace_at<std::pair<int_const,int>const&>
          (raw_hash_set<phmap::priv::NodeHashMapPolicy<int,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<int_const,int>>>
           *this,size_t i,pair<const_int,_int> *args)

{
  long lVar1;
  value_type *pvVar2;
  
  lVar1 = *(long *)(this + 8);
  pvVar2 = NodeHashMapPolicy<int,int>::
           new_element<phmap::priv::Alloc<std::pair<int_const,int>>,std::pair<int_const,int>const&>
                     ((Alloc<std::pair<const_int,_int>_> *)(this + 0x28),args);
  *(value_type **)(lVar1 + i * 8) = pvVar2;
  return;
}

Assistant:

void emplace_at(size_t i, Args&&... args) {
        PolicyTraits::construct(&alloc_ref(), slots_ + i,
                                std::forward<Args>(args)...);
        
#ifdef PHMAP_CHECK_CONSTRUCTED_VALUE
        // this check can be costly, so do it only when requested
        assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
               iterator_at(i) &&
               "constructed value does not match the lookup key");
#endif
    }